

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O1

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  jpeg_entropy_decoder *pjVar4;
  JBLOCKROW paJVar5;
  jpeg_error_mgr *pjVar6;
  bool bVar7;
  short sVar8;
  short sVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  uchar *st;
  
  pjVar4 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar4[3].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    piVar1 = (int *)((long)&pjVar4[3].start_pass + 4);
    *piVar1 = *piVar1 + -1;
  }
  if (pjVar4[1].insufficient_data != -1) {
    bVar2 = (byte)cinfo->Al;
    paJVar5 = *MCU_data;
    uVar12 = cinfo->Se;
    if (0 < (int)uVar12) {
      do {
        if ((*paJVar5)[jpeg_natural_order[uVar12]] != 0) goto LAB_00135db2;
        bVar7 = 1 < (int)uVar12;
        uVar12 = uVar12 - 1;
      } while (bVar7);
      uVar12 = 0;
    }
LAB_00135db2:
    iVar15 = cinfo->Ss;
    if (iVar15 <= cinfo->Se) {
      iVar3 = cinfo->cur_comp_info[0]->ac_tbl_no;
      do {
        lVar14 = *(long *)(&pjVar4[8].insufficient_data + (long)iVar3 * 2);
        lVar13 = (long)(iVar15 * 3 + -3);
        if (((int)uVar12 < iVar15) &&
           (iVar10 = arith_decode(cinfo,(uchar *)(lVar14 + lVar13)), iVar10 != 0)) {
          return 1;
        }
        st = (uchar *)(lVar14 + lVar13 + 2);
        lVar14 = 0;
        while( true ) {
          iVar10 = jpeg_natural_order[iVar15 + lVar14];
          sVar9 = (short)(1 << (bVar2 & 0x1f));
          sVar8 = (short)(-1 << (bVar2 & 0x1f));
          if ((*paJVar5)[iVar10] != 0) break;
          iVar11 = arith_decode(cinfo,st + -1);
          if (iVar11 != 0) {
            iVar11 = arith_decode(cinfo,(uchar *)(pjVar4 + 0xe));
            if (iVar11 != 0) {
              sVar9 = sVar8;
            }
            (*paJVar5)[iVar10] = sVar9;
            goto LAB_00135f09;
          }
          lVar13 = iVar15 + lVar14;
          lVar14 = lVar14 + 1;
          st = st + 3;
          if (cinfo->Se <= lVar13) {
            pjVar6 = cinfo->err;
            pjVar6->msg_code = 0x7e;
            (*pjVar6->emit_message)((j_common_ptr)cinfo,-1);
            pjVar4[1].insufficient_data = -1;
            return 1;
          }
        }
        iVar11 = arith_decode(cinfo,st);
        if (iVar11 != 0) {
          if (-1 < (*paJVar5)[iVar10]) {
            sVar8 = sVar9;
          }
          (*paJVar5)[iVar10] = (*paJVar5)[iVar10] + sVar8;
        }
LAB_00135f09:
        iVar10 = iVar15 + (int)lVar14;
        iVar15 = iVar15 + (int)lVar14 + 1;
      } while (iVar10 < cinfo->Se);
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  unsigned char *st;
  int tbl, k, kex;
  int p1, m1;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;   /* if error do nothing */

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  p1 = 1 << cinfo->Al;          /* 1 in the bit position being coded */
  m1 = (NEG_1) << cinfo->Al;    /* -1 in the bit position being coded */

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = cinfo->Se; kex > 0; kex--)
    if ((*block)[jpeg_natural_order[kex]]) break;

  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      if (arith_decode(cinfo, st)) break;       /* EOB flag */
    for (;;) {
      thiscoef = *block + jpeg_natural_order[k];
      if (*thiscoef) {                          /* previously nonzero coef */
        if (arith_decode(cinfo, st + 2)) {
          if (*thiscoef < 0)
            *thiscoef += m1;
          else
            *thiscoef += p1;
        }
        break;
      }
      if (arith_decode(cinfo, st + 1)) {        /* newly nonzero coef */
        if (arith_decode(cinfo, entropy->fixed_bin))
          *thiscoef = m1;
        else
          *thiscoef = p1;
        break;
      }
      st += 3;  k++;
      if (k > cinfo->Se) {
        WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
        entropy->ct = -1;                       /* spectral overflow */
        return TRUE;
      }
    }
  }

  return TRUE;
}